

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  ostream *local_28;
  char **pointer_local;
  Message *this_local;
  
  if (*pointer == (char *)0x0) {
    std::operator<<((ostream *)(this->ss_ + 0x10),"(null)");
  }
  else {
    local_28 = (ostream *)0x0;
    if (this->ss_ != (StrStream *)0x0) {
      local_28 = (ostream *)(this->ss_ + 0x10);
    }
    GTestStreamToHelper<char_const*>(local_28,pointer);
  }
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      ::GTestStreamToHelper(ss_, pointer);
    }
    return *this;
  }